

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

void __thiscall
Clasp::DefaultUnfoundedCheck::destroy(DefaultUnfoundedCheck *this,Solver *s,bool detach)

{
  pointer pBVar1;
  pointer pAVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  RemExtWatches remW;
  RemExtWatches local_40;
  
  if (s != (Solver *)0x0 && detach) {
    Solver::removePost(s,&this->super_PostPropagator);
    if ((this->bodies_).ebo_.size != 0) {
      uVar3 = 0;
      do {
        pBVar1 = (this->graph_->bodies_).ebo_.buf;
        local_40.self =
             (Constraint *)
             (CONCAT44(local_40.self._4_4_,pBVar1[uVar3].super_Node.lit.rep_) & 0xfffffffffffffffe ^
             2);
        Solver::removeWatch(s,(Literal *)&local_40,(Constraint *)this);
        if ((pBVar1[uVar3].super_Node.field_0x7 & 0x10) != 0) {
          local_40.self = (Constraint *)this;
          local_40.s = s;
          Asp::PrgDepGraph::visitBodyLiterals<Clasp::DefaultUnfoundedCheck::RemExtWatches>
                    (this->graph_,pBVar1 + uVar3,&local_40);
        }
        uVar4 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar4;
      } while (uVar4 != (this->bodies_).ebo_.size);
    }
    uVar3 = (ulong)(this->atoms_).ebo_.size;
    if (uVar3 != 0) {
      lVar5 = 0;
      do {
        pAVar2 = (this->graph_->atoms_).ebo_.buf;
        if (((&(pAVar2->super_Node).field_0x7)[lVar5] & 0x10) != 0) {
          local_40.self =
               (Constraint *)
               (CONCAT44(local_40.self._4_4_,
                         *(undefined4 *)((long)&(pAVar2->super_Node).lit.rep_ + lVar5)) &
                0xfffffffffffffffe ^ 2);
          Solver::removeWatch(s,(Literal *)&local_40,(Constraint *)this);
        }
        lVar5 = lVar5 + 0x18;
      } while (uVar3 * 0x18 != lVar5);
    }
  }
  Constraint::destroy((Constraint *)this,s,detach);
  return;
}

Assistant:

void DefaultUnfoundedCheck::destroy(Solver* s, bool detach) {
	if (s && detach) {
		s->removePost(this);
		for (uint32 i = 0; i != (uint32)bodies_.size(); ++i) {
			BodyPtr n(getBody(i));
			s->removeWatch(~n.node->lit, this);
			if (n.node->extended()) {
				RemExtWatches remW = { static_cast<Constraint*>(this), s };
				graph_->visitBodyLiterals(*n.node, remW);
			}
		}
		for (AtomVec::size_type i = 0, end = atoms_.size(); i != end; ++i) {
			const AtomNode& a = graph_->getAtom(NodeId(i));
			if (a.inChoice()) { s->removeWatch(~a.lit, this); }
		}
	}
	PostPropagator::destroy(s, detach);
}